

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_node_atomize(lys_node *node,lyxp_set *set,int warn_on_fwd_ref)

{
  LYS_NODE LVar1;
  lyxp_set *plVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  lys_node *node_00;
  LY_ERR *pLVar6;
  LY_VECODE *pLVar7;
  char *pcVar8;
  char *pcVar9;
  lys_node *plVar10;
  ulong uVar11;
  long lVar12;
  lyxp_node_type local_94;
  lys_node *plStack_90;
  lyxp_node_type ctx_snode_type;
  lyxp_set local_88;
  lyxp_set *local_50;
  uint local_48;
  int local_44;
  char *local_40;
  lys_node *local_38;
  
  local_50 = set;
  local_44 = warn_on_fwd_ref;
  local_38 = node;
  if ((warn_on_fwd_ref != 0) && (puVar5 = ly_vlog_hide_location(), *puVar5 != '\0')) {
    __assert_fail("!warn_on_fwd_ref || !*ly_vlog_hide_location()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x1dfe,"int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)");
  }
  local_88.used = 0;
  local_88.size = 0;
  local_88.ctx_pos = 0;
  local_88.ctx_size = 0;
  local_88.val.nodes = (lyxp_set_nodes *)0x0;
  local_88.val._8_8_ = 0;
  local_88.type = LYXP_SET_EMPTY;
  local_88._4_4_ = 0;
  local_88._8_8_ = 0;
  local_50->used = 0;
  local_50->size = 0;
  local_50->ctx_pos = 0;
  local_50->ctx_size = 0;
  (local_50->val).nodes = (lyxp_set_nodes *)0x0;
  *(undefined8 *)((long)&local_50->val + 8) = 0;
  *(undefined8 *)local_50 = 0;
  *(undefined8 *)&local_50->field_0x8 = 0;
  local_48 = 0x20;
  for (node_00 = local_38; node_00 != (lys_node *)0x0; node_00 = lys_parent(node_00)) {
    if (node_00->nodetype == LYS_OUTPUT) goto LAB_001612fa;
  }
  local_48 = 0;
LAB_001612fa:
  LVar1 = local_38->nodetype;
  uVar11 = 0;
  local_40 = (char *)0x0;
  plVar10 = (lys_node *)0x0;
  switch(LVar1) {
  case LYS_CONTAINER:
    local_40 = local_38[1].dsc;
    uVar11 = (ulong)local_38->padding[2];
    plVar10 = (lys_node *)local_38[1].name;
    break;
  case LYS_CHOICE:
    goto switchD_0016137b_caseD_2;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    break;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_0016137b_caseD_4:
    local_40 = local_38[1].dsc;
    uVar11 = (ulong)local_38->padding[3];
    plVar10 = (lys_node *)local_38[1].name;
    break;
  default:
    if (LVar1 == LYS_LIST) {
      local_40 = local_38[1].dsc;
      uVar11 = (ulong)local_38->padding[0];
      plVar10 = (lys_node *)local_38[1].name;
    }
    else {
      if (LVar1 == LYS_ANYXML) goto switchD_0016137b_caseD_4;
      if (LVar1 == LYS_CASE) {
switchD_0016137b_caseD_2:
        plVar10 = (lys_node *)local_38[1].name;
      }
      else {
        if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_INPUT)) || (LVar1 == LYS_OUTPUT)) {
          local_40 = local_38[1].dsc;
          uVar11 = (ulong)local_38->padding[3];
          plVar10 = (lys_node *)0x0;
          break;
        }
        if (LVar1 == LYS_USES) goto switchD_0016137b_caseD_2;
        if (LVar1 != LYS_AUGMENT) {
          local_40 = (char *)0x0;
          plVar10 = (lys_node *)0x0;
          if (LVar1 == LYS_ANYDATA) goto switchD_0016137b_caseD_4;
          break;
        }
        plVar10 = local_38->next;
      }
      uVar11 = 0;
      local_40 = (char *)0x0;
    }
  }
  plStack_90 = node_00;
  if (local_44 != 0) {
    ly_vlog_hide('\x01');
  }
  if (plVar10 == (lys_node *)0x0) {
    iVar3 = 0;
LAB_00161518:
    local_48 = local_48 | 8;
    for (lVar12 = 0; uVar11 * 0x38 - lVar12 != 0; lVar12 = lVar12 + 0x38) {
      iVar4 = lyxp_atomize(*(char **)(local_40 + lVar12),local_38,LYXP_NODE_ELEM,&local_88,local_48)
      ;
      if (iVar4 == 0) {
        set_snode_merge(local_50,&local_88);
      }
      else {
        free(local_88.val.nodes);
        pLVar6 = ly_errno_location();
        if ((*pLVar6 != LY_EVALID) || (pLVar7 = ly_vecode_location(), *pLVar7 != LYVE_XPATH_INSNODE)
           ) {
          pcVar8 = *(char **)(local_40 + lVar12);
          pcVar9 = "Invalid must restriction \"%s\".";
          goto LAB_0016162b;
        }
        if (local_44 == 0) {
          pcVar8 = *(char **)(local_40 + lVar12);
          pcVar9 = "Invalid must restriction \"%s\".";
          goto LAB_00161673;
        }
        ly_vlog_hide('\0');
        if ('\0' < ly_log_level) {
          pcVar8 = ly_errmsg();
          ly_log(LY_LLWRN,pcVar8);
        }
        pcVar8 = lys_path(local_38);
        if ('\0' < ly_log_level) {
          ly_log(LY_LLWRN,"Invalid must restriction \"%s\". (%s)",*(undefined8 *)(local_40 + lVar12)
                 ,pcVar8);
        }
        free(pcVar8);
        ly_vlog_hide('\x01');
        iVar3 = 1;
      }
      local_88.used = 0;
      local_88.size = 0;
      local_88.ctx_pos = 0;
      local_88.ctx_size = 0;
      local_88.val.nodes = (lyxp_set_nodes *)0x0;
      local_88.val._8_8_ = 0;
      local_88.type = LYXP_SET_EMPTY;
      local_88._4_4_ = 0;
      local_88._8_8_ = 0;
    }
  }
  else {
    resolve_when_ctx_snode(local_38,&stack0xffffffffffffff70,&local_94);
    iVar3 = lyxp_atomize(plVar10->name,plStack_90,local_94,&local_88,local_48 | 0x10);
    if (iVar3 == 0) {
      set_snode_merge(local_50,&local_88);
      iVar3 = 0;
LAB_00161509:
      local_88.used = 0;
      local_88.size = 0;
      local_88.ctx_pos = 0;
      local_88.ctx_size = 0;
      local_88.val.nodes = (lyxp_set_nodes *)0x0;
      local_88.val._8_8_ = 0;
      local_88.type = LYXP_SET_EMPTY;
      local_88._4_4_ = 0;
      local_88._8_8_ = 0;
      goto LAB_00161518;
    }
    free(local_88.val.nodes);
    pLVar6 = ly_errno_location();
    if ((*pLVar6 == LY_EVALID) &&
       ((pLVar7 = ly_vecode_location(), *pLVar7 == LYVE_XPATH_INSNODE ||
        (pLVar7 = ly_vecode_location(), *pLVar7 == LYVE_XPATH_INMOD)))) {
      if (local_44 == 0) {
        pcVar8 = plVar10->name;
        pcVar9 = "Invalid when condition \"%s\".";
LAB_00161673:
        ly_vlog(LYE_SPEC,LY_VLOG_LYS,local_38,pcVar9,pcVar8);
        iVar3 = 1;
        goto LAB_00161688;
      }
      ly_vlog_hide('\0');
      if ('\0' < ly_log_level) {
        pcVar8 = ly_errmsg();
        ly_log(LY_LLWRN,pcVar8);
      }
      iVar3 = 1;
      pcVar8 = lys_path(local_38);
      if ('\0' < ly_log_level) {
        ly_log(LY_LLWRN,"Invalid when condition \"%s\". (%s)",plVar10->name,pcVar8);
      }
      free(pcVar8);
      ly_vlog_hide('\x01');
      goto LAB_00161509;
    }
    pcVar8 = plVar10->name;
    pcVar9 = "Invalid when condition \"%s\".";
LAB_0016162b:
    iVar3 = -1;
    ly_vlog(LYE_SPEC,LY_VLOG_LYS,local_38,pcVar9,pcVar8);
  }
  if (local_44 != 0) {
    ly_vlog_hide('\0');
  }
  if (iVar3 == 0) {
    return 0;
  }
LAB_00161688:
  plVar2 = local_50;
  free((local_50->val).nodes);
  plVar2->used = 0;
  plVar2->size = 0;
  plVar2->ctx_pos = 0;
  plVar2->ctx_size = 0;
  (plVar2->val).nodes = (lyxp_set_nodes *)0x0;
  *(undefined8 *)((long)&plVar2->val + 8) = 0;
  *(undefined8 *)plVar2 = 0;
  *(undefined8 *)&plVar2->field_0x8 = 0;
  return iVar3;
}

Assistant:

int
lyxp_node_atomize(const struct lys_node *node, struct lyxp_set *set, int warn_on_fwd_ref)
{
    struct lys_node *ctx_snode;
    enum lyxp_node_type ctx_snode_type;
    struct lyxp_set tmp_set;
    uint8_t must_size = 0;
    uint32_t i;
    int opts, ret = EXIT_SUCCESS;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    char *path;

    assert(!warn_on_fwd_ref || !*ly_vlog_hide_location());

    memset(&tmp_set, 0, sizeof tmp_set);
    memset(set, 0, sizeof *set);

    /* check if we will be traversing RPC output */
    opts = 0;
    for (ctx_snode = (struct lys_node *)node; ctx_snode && (ctx_snode->nodetype != LYS_OUTPUT); ctx_snode = lys_parent(ctx_snode));
    if (ctx_snode) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    if (warn_on_fwd_ref) {
        /* hide errors, we can print only warnings */
        ly_vlog_hide(1);
    }

    /* check "when" */
    if (when) {
        resolve_when_ctx_snode(node, &ctx_snode, &ctx_snode_type);
        if (lyxp_atomize(when->cond, ctx_snode, ctx_snode_type, &tmp_set, LYXP_SNODE_WHEN | opts)) {
            free(tmp_set.val.snodes);
            if ((ly_errno != LY_EVALID) || ((ly_vecode != LYVE_XPATH_INSNODE) && (ly_vecode != LYVE_XPATH_INMOD))) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
                ret = -1;
                goto finish;
            } else if (!warn_on_fwd_ref) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
                ret = EXIT_FAILURE;
                goto finish;
            }
            ly_vlog_hide(0);
            LOGWRN(ly_errmsg());
            path = lys_path(node);
            LOGWRN("Invalid when condition \"%s\". (%s)", when->cond, path);
            free(path);
            ly_vlog_hide(1);

            ret = EXIT_FAILURE;
            memset(&tmp_set, 0, sizeof tmp_set);
        } else {
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        if (lyxp_atomize(must[i].expr, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_MUST | opts)) {
            free(tmp_set.val.snodes);
            if ((ly_errno != LY_EVALID) || (ly_vecode != LYVE_XPATH_INSNODE)) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
                ret = -1;
                goto finish;
            } else if (!warn_on_fwd_ref) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
                ret = EXIT_FAILURE;
                goto finish;
            }
            ly_vlog_hide(0);
            LOGWRN(ly_errmsg());
            path = lys_path(node);
            LOGWRN("Invalid must restriction \"%s\". (%s)", must[i].expr, path);
            free(path);
            ly_vlog_hide(1);

            ret = EXIT_FAILURE;
            memset(&tmp_set, 0, sizeof tmp_set);
        } else {
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

finish:
    if (warn_on_fwd_ref) {
        ly_vlog_hide(0);
    }
    if (ret) {
        free(set->val.snodes);
        memset(set, 0, sizeof *set);
    }
    return ret;
}